

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void col_txfm_16x16_rounding(__m128i *in,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  longlong lVar33;
  longlong lVar34;
  longlong lVar35;
  longlong lVar36;
  longlong lVar37;
  longlong lVar38;
  longlong lVar39;
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  longlong lVar43;
  longlong lVar44;
  longlong lVar45;
  longlong lVar46;
  longlong lVar47;
  longlong lVar48;
  longlong lVar49;
  longlong lVar50;
  longlong lVar51;
  longlong lVar52;
  longlong lVar53;
  longlong lVar54;
  longlong lVar55;
  longlong lVar56;
  longlong lVar57;
  longlong lVar58;
  longlong lVar59;
  longlong lVar60;
  longlong lVar61;
  longlong lVar62;
  longlong lVar63;
  int iVar64;
  __m128i rounding;
  undefined1 auVar65 [16];
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar64 = 1 << ((char)shift - 1U & 0x1f);
  iVar1 = *(int *)((long)*in + 4);
  lVar33 = (*in)[1];
  iVar2 = *(int *)((long)*in + 0xc);
  lVar34 = in[1][0];
  iVar3 = *(int *)((long)in[1] + 4);
  lVar35 = in[1][1];
  iVar4 = *(int *)((long)in[1] + 0xc);
  lVar36 = in[2][0];
  iVar5 = *(int *)((long)in[2] + 4);
  lVar37 = in[2][1];
  iVar6 = *(int *)((long)in[2] + 0xc);
  lVar38 = in[3][0];
  iVar7 = *(int *)((long)in[3] + 4);
  lVar39 = in[3][1];
  iVar8 = *(int *)((long)in[3] + 0xc);
  lVar40 = in[4][0];
  iVar9 = *(int *)((long)in[4] + 4);
  lVar41 = in[4][1];
  iVar10 = *(int *)((long)in[4] + 0xc);
  lVar42 = in[5][0];
  iVar11 = *(int *)((long)in[5] + 4);
  lVar43 = in[5][1];
  iVar12 = *(int *)((long)in[5] + 0xc);
  lVar44 = in[6][0];
  iVar13 = *(int *)((long)in[6] + 4);
  lVar45 = in[6][1];
  iVar14 = *(int *)((long)in[6] + 0xc);
  lVar46 = in[7][0];
  iVar15 = *(int *)((long)in[7] + 4);
  lVar47 = in[7][1];
  iVar16 = *(int *)((long)in[7] + 0xc);
  lVar60 = in[8][0];
  lVar61 = in[8][1];
  lVar48 = in[9][0];
  iVar17 = *(int *)((long)in[9] + 4);
  lVar49 = in[9][1];
  iVar18 = *(int *)((long)in[9] + 0xc);
  lVar50 = in[10][0];
  iVar19 = *(int *)((long)in[10] + 4);
  lVar51 = in[10][1];
  iVar20 = *(int *)((long)in[10] + 0xc);
  lVar52 = in[0xb][0];
  iVar21 = *(int *)((long)in[0xb] + 4);
  lVar53 = in[0xb][1];
  iVar22 = *(int *)((long)in[0xb] + 0xc);
  lVar62 = in[0xc][0];
  lVar63 = in[0xc][1];
  auVar65 = ZEXT416((uint)shift);
  lVar54 = in[0xd][0];
  iVar23 = *(int *)((long)in[0xd] + 4);
  lVar55 = in[0xd][1];
  iVar24 = *(int *)((long)in[0xd] + 0xc);
  lVar56 = in[0xe][0];
  iVar25 = *(int *)((long)in[0xe] + 4);
  lVar57 = in[0xe][1];
  iVar26 = *(int *)((long)in[0xe] + 0xc);
  lVar58 = in[0xf][0];
  iVar27 = *(int *)((long)in[0xf] + 4);
  lVar59 = in[0xf][1];
  iVar28 = *(int *)((long)in[0xf] + 0xc);
  *(int *)*in = (int)(*in)[0] + iVar64 >> auVar65;
  *(int *)((long)*in + 4) = iVar1 + iVar64 >> auVar65;
  *(int *)(*in + 1) = (int)lVar33 + iVar64 >> auVar65;
  *(int *)((long)*in + 0xc) = iVar2 + iVar64 >> auVar65;
  *(int *)in[1] = (int)lVar34 + iVar64 >> auVar65;
  *(int *)((long)in[1] + 4) = iVar3 + iVar64 >> auVar65;
  *(int *)(in[1] + 1) = (int)lVar35 + iVar64 >> auVar65;
  *(int *)((long)in[1] + 0xc) = iVar4 + iVar64 >> auVar65;
  local_28 = (int)lVar60;
  iStack_24 = (int)((ulong)lVar60 >> 0x20);
  iStack_20 = (int)lVar61;
  iStack_1c = (int)((ulong)lVar61 >> 0x20);
  local_18 = (int)lVar62;
  iStack_14 = (int)((ulong)lVar62 >> 0x20);
  iStack_10 = (int)lVar63;
  iStack_c = (int)((ulong)lVar63 >> 0x20);
  *(int *)in[2] = (int)lVar36 + iVar64 >> auVar65;
  *(int *)((long)in[2] + 4) = iVar5 + iVar64 >> auVar65;
  *(int *)(in[2] + 1) = (int)lVar37 + iVar64 >> auVar65;
  *(int *)((long)in[2] + 0xc) = iVar6 + iVar64 >> auVar65;
  *(int *)in[3] = (int)lVar38 + iVar64 >> auVar65;
  *(int *)((long)in[3] + 4) = iVar7 + iVar64 >> auVar65;
  *(int *)(in[3] + 1) = (int)lVar39 + iVar64 >> auVar65;
  *(int *)((long)in[3] + 0xc) = iVar8 + iVar64 >> auVar65;
  *(int *)in[4] = (int)lVar40 + iVar64 >> auVar65;
  *(int *)((long)in[4] + 4) = iVar9 + iVar64 >> auVar65;
  *(int *)(in[4] + 1) = (int)lVar41 + iVar64 >> auVar65;
  *(int *)((long)in[4] + 0xc) = iVar10 + iVar64 >> auVar65;
  *(int *)in[5] = (int)lVar42 + iVar64 >> auVar65;
  *(int *)((long)in[5] + 4) = iVar11 + iVar64 >> auVar65;
  *(int *)(in[5] + 1) = (int)lVar43 + iVar64 >> auVar65;
  *(int *)((long)in[5] + 0xc) = iVar12 + iVar64 >> auVar65;
  *(int *)in[6] = (int)lVar44 + iVar64 >> auVar65;
  *(int *)((long)in[6] + 4) = iVar13 + iVar64 >> auVar65;
  *(int *)(in[6] + 1) = (int)lVar45 + iVar64 >> auVar65;
  *(int *)((long)in[6] + 0xc) = iVar14 + iVar64 >> auVar65;
  *(int *)in[7] = (int)lVar46 + iVar64 >> auVar65;
  *(int *)((long)in[7] + 4) = iVar15 + iVar64 >> auVar65;
  *(int *)(in[7] + 1) = (int)lVar47 + iVar64 >> auVar65;
  *(int *)((long)in[7] + 0xc) = iVar16 + iVar64 >> auVar65;
  *(int *)in[8] = local_28 + iVar64 >> auVar65;
  *(int *)((long)in[8] + 4) = iStack_24 + iVar64 >> auVar65;
  *(int *)(in[8] + 1) = iStack_20 + iVar64 >> auVar65;
  *(int *)((long)in[8] + 0xc) = iStack_1c + iVar64 >> auVar65;
  *(int *)in[9] = (int)lVar48 + iVar64 >> auVar65;
  *(int *)((long)in[9] + 4) = iVar17 + iVar64 >> auVar65;
  *(int *)(in[9] + 1) = (int)lVar49 + iVar64 >> auVar65;
  *(int *)((long)in[9] + 0xc) = iVar18 + iVar64 >> auVar65;
  *(int *)in[10] = (int)lVar50 + iVar64 >> auVar65;
  *(int *)((long)in[10] + 4) = iVar19 + iVar64 >> auVar65;
  *(int *)(in[10] + 1) = (int)lVar51 + iVar64 >> auVar65;
  *(int *)((long)in[10] + 0xc) = iVar20 + iVar64 >> auVar65;
  *(int *)in[0xb] = (int)lVar52 + iVar64 >> auVar65;
  *(int *)((long)in[0xb] + 4) = iVar21 + iVar64 >> auVar65;
  *(int *)(in[0xb] + 1) = (int)lVar53 + iVar64 >> auVar65;
  *(int *)((long)in[0xb] + 0xc) = iVar22 + iVar64 >> auVar65;
  *(int *)in[0xc] = local_18 + iVar64 >> auVar65;
  *(int *)((long)in[0xc] + 4) = iStack_14 + iVar64 >> auVar65;
  *(int *)(in[0xc] + 1) = iStack_10 + iVar64 >> auVar65;
  *(int *)((long)in[0xc] + 0xc) = iStack_c + iVar64 >> auVar65;
  *(int *)in[0xd] = (int)lVar54 + iVar64 >> auVar65;
  *(int *)((long)in[0xd] + 4) = iVar23 + iVar64 >> auVar65;
  *(int *)(in[0xd] + 1) = (int)lVar55 + iVar64 >> auVar65;
  *(int *)((long)in[0xd] + 0xc) = iVar24 + iVar64 >> auVar65;
  *(int *)in[0xe] = (int)lVar56 + iVar64 >> auVar65;
  *(int *)((long)in[0xe] + 4) = iVar25 + iVar64 >> auVar65;
  *(int *)(in[0xe] + 1) = (int)lVar57 + iVar64 >> auVar65;
  *(int *)((long)in[0xe] + 0xc) = iVar26 + iVar64 >> auVar65;
  *(int *)in[0xf] = (int)lVar58 + iVar64 >> auVar65;
  *(int *)((long)in[0xf] + 4) = iVar27 + iVar64 >> auVar65;
  *(int *)(in[0xf] + 1) = (int)lVar59 + iVar64 >> auVar65;
  *(int *)((long)in[0xf] + 0xc) = iVar28 + iVar64 >> auVar65;
  iVar1 = *(int *)((long)in[0x10] + 4);
  lVar33 = in[0x10][1];
  iVar2 = *(int *)((long)in[0x10] + 0xc);
  lVar34 = in[0x11][0];
  iVar3 = *(int *)((long)in[0x11] + 4);
  lVar35 = in[0x11][1];
  iVar4 = *(int *)((long)in[0x11] + 0xc);
  lVar36 = in[0x12][0];
  iVar5 = *(int *)((long)in[0x12] + 4);
  lVar37 = in[0x12][1];
  iVar6 = *(int *)((long)in[0x12] + 0xc);
  lVar38 = in[0x13][0];
  iVar7 = *(int *)((long)in[0x13] + 4);
  lVar39 = in[0x13][1];
  iVar8 = *(int *)((long)in[0x13] + 0xc);
  lVar40 = in[0x14][0];
  iVar9 = *(int *)((long)in[0x14] + 4);
  lVar41 = in[0x14][1];
  iVar10 = *(int *)((long)in[0x14] + 0xc);
  lVar42 = in[0x15][0];
  iVar11 = *(int *)((long)in[0x15] + 4);
  lVar43 = in[0x15][1];
  iVar12 = *(int *)((long)in[0x15] + 0xc);
  lVar44 = in[0x16][0];
  iVar13 = *(int *)((long)in[0x16] + 4);
  lVar45 = in[0x16][1];
  iVar14 = *(int *)((long)in[0x16] + 0xc);
  lVar46 = in[0x17][0];
  iVar15 = *(int *)((long)in[0x17] + 4);
  lVar47 = in[0x17][1];
  iVar16 = *(int *)((long)in[0x17] + 0xc);
  lVar60 = in[0x18][0];
  lVar61 = in[0x18][1];
  lVar48 = in[0x19][0];
  iVar17 = *(int *)((long)in[0x19] + 4);
  lVar49 = in[0x19][1];
  iVar18 = *(int *)((long)in[0x19] + 0xc);
  lVar50 = in[0x1a][0];
  iVar19 = *(int *)((long)in[0x1a] + 4);
  lVar51 = in[0x1a][1];
  iVar20 = *(int *)((long)in[0x1a] + 0xc);
  lVar52 = in[0x1b][0];
  iVar21 = *(int *)((long)in[0x1b] + 4);
  lVar53 = in[0x1b][1];
  iVar22 = *(int *)((long)in[0x1b] + 0xc);
  lVar62 = in[0x1c][0];
  lVar63 = in[0x1c][1];
  lVar54 = in[0x1d][0];
  iVar23 = *(int *)((long)in[0x1d] + 4);
  lVar55 = in[0x1d][1];
  iVar24 = *(int *)((long)in[0x1d] + 0xc);
  lVar56 = in[0x1e][0];
  iVar25 = *(int *)((long)in[0x1e] + 4);
  lVar57 = in[0x1e][1];
  iVar26 = *(int *)((long)in[0x1e] + 0xc);
  lVar58 = in[0x1f][0];
  iVar27 = *(int *)((long)in[0x1f] + 4);
  lVar59 = in[0x1f][1];
  iVar28 = *(int *)((long)in[0x1f] + 0xc);
  *(int *)in[0x10] = (int)in[0x10][0] + iVar64 >> auVar65;
  *(int *)((long)in[0x10] + 4) = iVar1 + iVar64 >> auVar65;
  *(int *)(in[0x10] + 1) = (int)lVar33 + iVar64 >> auVar65;
  *(int *)((long)in[0x10] + 0xc) = iVar2 + iVar64 >> auVar65;
  *(int *)in[0x11] = (int)lVar34 + iVar64 >> auVar65;
  *(int *)((long)in[0x11] + 4) = iVar3 + iVar64 >> auVar65;
  *(int *)(in[0x11] + 1) = (int)lVar35 + iVar64 >> auVar65;
  *(int *)((long)in[0x11] + 0xc) = iVar4 + iVar64 >> auVar65;
  local_28 = (int)lVar60;
  iStack_24 = (int)((ulong)lVar60 >> 0x20);
  iStack_20 = (int)lVar61;
  iStack_1c = (int)((ulong)lVar61 >> 0x20);
  local_18 = (int)lVar62;
  iStack_14 = (int)((ulong)lVar62 >> 0x20);
  iStack_10 = (int)lVar63;
  iStack_c = (int)((ulong)lVar63 >> 0x20);
  *(int *)in[0x12] = (int)lVar36 + iVar64 >> auVar65;
  *(int *)((long)in[0x12] + 4) = iVar5 + iVar64 >> auVar65;
  *(int *)(in[0x12] + 1) = (int)lVar37 + iVar64 >> auVar65;
  *(int *)((long)in[0x12] + 0xc) = iVar6 + iVar64 >> auVar65;
  *(int *)in[0x13] = (int)lVar38 + iVar64 >> auVar65;
  *(int *)((long)in[0x13] + 4) = iVar7 + iVar64 >> auVar65;
  *(int *)(in[0x13] + 1) = (int)lVar39 + iVar64 >> auVar65;
  *(int *)((long)in[0x13] + 0xc) = iVar8 + iVar64 >> auVar65;
  *(int *)in[0x14] = (int)lVar40 + iVar64 >> auVar65;
  *(int *)((long)in[0x14] + 4) = iVar9 + iVar64 >> auVar65;
  *(int *)(in[0x14] + 1) = (int)lVar41 + iVar64 >> auVar65;
  *(int *)((long)in[0x14] + 0xc) = iVar10 + iVar64 >> auVar65;
  *(int *)in[0x15] = (int)lVar42 + iVar64 >> auVar65;
  *(int *)((long)in[0x15] + 4) = iVar11 + iVar64 >> auVar65;
  *(int *)(in[0x15] + 1) = (int)lVar43 + iVar64 >> auVar65;
  *(int *)((long)in[0x15] + 0xc) = iVar12 + iVar64 >> auVar65;
  *(int *)in[0x16] = (int)lVar44 + iVar64 >> auVar65;
  *(int *)((long)in[0x16] + 4) = iVar13 + iVar64 >> auVar65;
  *(int *)(in[0x16] + 1) = (int)lVar45 + iVar64 >> auVar65;
  *(int *)((long)in[0x16] + 0xc) = iVar14 + iVar64 >> auVar65;
  *(int *)in[0x17] = (int)lVar46 + iVar64 >> auVar65;
  *(int *)((long)in[0x17] + 4) = iVar15 + iVar64 >> auVar65;
  *(int *)(in[0x17] + 1) = (int)lVar47 + iVar64 >> auVar65;
  *(int *)((long)in[0x17] + 0xc) = iVar16 + iVar64 >> auVar65;
  *(int *)in[0x18] = local_28 + iVar64 >> auVar65;
  *(int *)((long)in[0x18] + 4) = iStack_24 + iVar64 >> auVar65;
  *(int *)(in[0x18] + 1) = iStack_20 + iVar64 >> auVar65;
  *(int *)((long)in[0x18] + 0xc) = iStack_1c + iVar64 >> auVar65;
  *(int *)in[0x19] = (int)lVar48 + iVar64 >> auVar65;
  *(int *)((long)in[0x19] + 4) = iVar17 + iVar64 >> auVar65;
  *(int *)(in[0x19] + 1) = (int)lVar49 + iVar64 >> auVar65;
  *(int *)((long)in[0x19] + 0xc) = iVar18 + iVar64 >> auVar65;
  *(int *)in[0x1a] = (int)lVar50 + iVar64 >> auVar65;
  *(int *)((long)in[0x1a] + 4) = iVar19 + iVar64 >> auVar65;
  *(int *)(in[0x1a] + 1) = (int)lVar51 + iVar64 >> auVar65;
  *(int *)((long)in[0x1a] + 0xc) = iVar20 + iVar64 >> auVar65;
  *(int *)in[0x1b] = (int)lVar52 + iVar64 >> auVar65;
  *(int *)((long)in[0x1b] + 4) = iVar21 + iVar64 >> auVar65;
  *(int *)(in[0x1b] + 1) = (int)lVar53 + iVar64 >> auVar65;
  *(int *)((long)in[0x1b] + 0xc) = iVar22 + iVar64 >> auVar65;
  *(int *)in[0x1c] = local_18 + iVar64 >> auVar65;
  *(int *)((long)in[0x1c] + 4) = iStack_14 + iVar64 >> auVar65;
  *(int *)(in[0x1c] + 1) = iStack_10 + iVar64 >> auVar65;
  *(int *)((long)in[0x1c] + 0xc) = iStack_c + iVar64 >> auVar65;
  *(int *)in[0x1d] = (int)lVar54 + iVar64 >> auVar65;
  *(int *)((long)in[0x1d] + 4) = iVar23 + iVar64 >> auVar65;
  *(int *)(in[0x1d] + 1) = (int)lVar55 + iVar64 >> auVar65;
  *(int *)((long)in[0x1d] + 0xc) = iVar24 + iVar64 >> auVar65;
  *(int *)in[0x1e] = (int)lVar56 + iVar64 >> auVar65;
  *(int *)((long)in[0x1e] + 4) = iVar25 + iVar64 >> auVar65;
  *(int *)(in[0x1e] + 1) = (int)lVar57 + iVar64 >> auVar65;
  *(int *)((long)in[0x1e] + 0xc) = iVar26 + iVar64 >> auVar65;
  *(int *)in[0x1f] = (int)lVar58 + iVar64 >> auVar65;
  *(int *)((long)in[0x1f] + 4) = iVar27 + iVar64 >> auVar65;
  *(int *)(in[0x1f] + 1) = (int)lVar59 + iVar64 >> auVar65;
  *(int *)((long)in[0x1f] + 0xc) = iVar28 + iVar64 >> auVar65;
  iVar1 = *(int *)((long)in[0x20] + 4);
  lVar33 = in[0x20][1];
  iVar2 = *(int *)((long)in[0x20] + 0xc);
  lVar34 = in[0x21][0];
  iVar3 = *(int *)((long)in[0x21] + 4);
  lVar35 = in[0x21][1];
  iVar4 = *(int *)((long)in[0x21] + 0xc);
  lVar36 = in[0x22][0];
  iVar5 = *(int *)((long)in[0x22] + 4);
  lVar37 = in[0x22][1];
  iVar6 = *(int *)((long)in[0x22] + 0xc);
  lVar38 = in[0x23][0];
  iVar7 = *(int *)((long)in[0x23] + 4);
  lVar39 = in[0x23][1];
  iVar8 = *(int *)((long)in[0x23] + 0xc);
  lVar40 = in[0x24][0];
  iVar9 = *(int *)((long)in[0x24] + 4);
  lVar41 = in[0x24][1];
  iVar10 = *(int *)((long)in[0x24] + 0xc);
  lVar42 = in[0x25][0];
  iVar11 = *(int *)((long)in[0x25] + 4);
  lVar43 = in[0x25][1];
  iVar12 = *(int *)((long)in[0x25] + 0xc);
  lVar44 = in[0x26][0];
  iVar13 = *(int *)((long)in[0x26] + 4);
  lVar45 = in[0x26][1];
  iVar14 = *(int *)((long)in[0x26] + 0xc);
  lVar46 = in[0x27][0];
  iVar15 = *(int *)((long)in[0x27] + 4);
  lVar47 = in[0x27][1];
  iVar16 = *(int *)((long)in[0x27] + 0xc);
  lVar60 = in[0x28][0];
  lVar61 = in[0x28][1];
  lVar48 = in[0x29][0];
  iVar17 = *(int *)((long)in[0x29] + 4);
  lVar49 = in[0x29][1];
  iVar18 = *(int *)((long)in[0x29] + 0xc);
  lVar50 = in[0x2a][0];
  iVar19 = *(int *)((long)in[0x2a] + 4);
  lVar51 = in[0x2a][1];
  iVar20 = *(int *)((long)in[0x2a] + 0xc);
  lVar52 = in[0x2b][0];
  iVar21 = *(int *)((long)in[0x2b] + 4);
  lVar53 = in[0x2b][1];
  iVar22 = *(int *)((long)in[0x2b] + 0xc);
  lVar62 = in[0x2c][0];
  lVar63 = in[0x2c][1];
  lVar54 = in[0x2d][0];
  iVar23 = *(int *)((long)in[0x2d] + 4);
  lVar55 = in[0x2d][1];
  iVar24 = *(int *)((long)in[0x2d] + 0xc);
  lVar56 = in[0x2e][0];
  iVar25 = *(int *)((long)in[0x2e] + 4);
  lVar57 = in[0x2e][1];
  iVar26 = *(int *)((long)in[0x2e] + 0xc);
  lVar58 = in[0x2f][0];
  iVar27 = *(int *)((long)in[0x2f] + 4);
  lVar59 = in[0x2f][1];
  iVar28 = *(int *)((long)in[0x2f] + 0xc);
  *(int *)in[0x20] = (int)in[0x20][0] + iVar64 >> auVar65;
  *(int *)((long)in[0x20] + 4) = iVar1 + iVar64 >> auVar65;
  *(int *)(in[0x20] + 1) = (int)lVar33 + iVar64 >> auVar65;
  *(int *)((long)in[0x20] + 0xc) = iVar2 + iVar64 >> auVar65;
  *(int *)in[0x21] = (int)lVar34 + iVar64 >> auVar65;
  *(int *)((long)in[0x21] + 4) = iVar3 + iVar64 >> auVar65;
  *(int *)(in[0x21] + 1) = (int)lVar35 + iVar64 >> auVar65;
  *(int *)((long)in[0x21] + 0xc) = iVar4 + iVar64 >> auVar65;
  local_28 = (int)lVar60;
  iStack_24 = (int)((ulong)lVar60 >> 0x20);
  iStack_20 = (int)lVar61;
  iStack_1c = (int)((ulong)lVar61 >> 0x20);
  local_18 = (int)lVar62;
  iStack_14 = (int)((ulong)lVar62 >> 0x20);
  iStack_10 = (int)lVar63;
  iStack_c = (int)((ulong)lVar63 >> 0x20);
  *(int *)in[0x22] = (int)lVar36 + iVar64 >> auVar65;
  *(int *)((long)in[0x22] + 4) = iVar5 + iVar64 >> auVar65;
  *(int *)(in[0x22] + 1) = (int)lVar37 + iVar64 >> auVar65;
  *(int *)((long)in[0x22] + 0xc) = iVar6 + iVar64 >> auVar65;
  *(int *)in[0x23] = (int)lVar38 + iVar64 >> auVar65;
  *(int *)((long)in[0x23] + 4) = iVar7 + iVar64 >> auVar65;
  *(int *)(in[0x23] + 1) = (int)lVar39 + iVar64 >> auVar65;
  *(int *)((long)in[0x23] + 0xc) = iVar8 + iVar64 >> auVar65;
  *(int *)in[0x24] = (int)lVar40 + iVar64 >> auVar65;
  *(int *)((long)in[0x24] + 4) = iVar9 + iVar64 >> auVar65;
  *(int *)(in[0x24] + 1) = (int)lVar41 + iVar64 >> auVar65;
  *(int *)((long)in[0x24] + 0xc) = iVar10 + iVar64 >> auVar65;
  *(int *)in[0x25] = (int)lVar42 + iVar64 >> auVar65;
  *(int *)((long)in[0x25] + 4) = iVar11 + iVar64 >> auVar65;
  *(int *)(in[0x25] + 1) = (int)lVar43 + iVar64 >> auVar65;
  *(int *)((long)in[0x25] + 0xc) = iVar12 + iVar64 >> auVar65;
  *(int *)in[0x26] = (int)lVar44 + iVar64 >> auVar65;
  *(int *)((long)in[0x26] + 4) = iVar13 + iVar64 >> auVar65;
  *(int *)(in[0x26] + 1) = (int)lVar45 + iVar64 >> auVar65;
  *(int *)((long)in[0x26] + 0xc) = iVar14 + iVar64 >> auVar65;
  *(int *)in[0x27] = (int)lVar46 + iVar64 >> auVar65;
  *(int *)((long)in[0x27] + 4) = iVar15 + iVar64 >> auVar65;
  *(int *)(in[0x27] + 1) = (int)lVar47 + iVar64 >> auVar65;
  *(int *)((long)in[0x27] + 0xc) = iVar16 + iVar64 >> auVar65;
  *(int *)in[0x28] = local_28 + iVar64 >> auVar65;
  *(int *)((long)in[0x28] + 4) = iStack_24 + iVar64 >> auVar65;
  *(int *)(in[0x28] + 1) = iStack_20 + iVar64 >> auVar65;
  *(int *)((long)in[0x28] + 0xc) = iStack_1c + iVar64 >> auVar65;
  *(int *)in[0x29] = (int)lVar48 + iVar64 >> auVar65;
  *(int *)((long)in[0x29] + 4) = iVar17 + iVar64 >> auVar65;
  *(int *)(in[0x29] + 1) = (int)lVar49 + iVar64 >> auVar65;
  *(int *)((long)in[0x29] + 0xc) = iVar18 + iVar64 >> auVar65;
  *(int *)in[0x2a] = (int)lVar50 + iVar64 >> auVar65;
  *(int *)((long)in[0x2a] + 4) = iVar19 + iVar64 >> auVar65;
  *(int *)(in[0x2a] + 1) = (int)lVar51 + iVar64 >> auVar65;
  *(int *)((long)in[0x2a] + 0xc) = iVar20 + iVar64 >> auVar65;
  *(int *)in[0x2b] = (int)lVar52 + iVar64 >> auVar65;
  *(int *)((long)in[0x2b] + 4) = iVar21 + iVar64 >> auVar65;
  *(int *)(in[0x2b] + 1) = (int)lVar53 + iVar64 >> auVar65;
  *(int *)((long)in[0x2b] + 0xc) = iVar22 + iVar64 >> auVar65;
  *(int *)in[0x2c] = local_18 + iVar64 >> auVar65;
  *(int *)((long)in[0x2c] + 4) = iStack_14 + iVar64 >> auVar65;
  *(int *)(in[0x2c] + 1) = iStack_10 + iVar64 >> auVar65;
  *(int *)((long)in[0x2c] + 0xc) = iStack_c + iVar64 >> auVar65;
  *(int *)in[0x2d] = (int)lVar54 + iVar64 >> auVar65;
  *(int *)((long)in[0x2d] + 4) = iVar23 + iVar64 >> auVar65;
  *(int *)(in[0x2d] + 1) = (int)lVar55 + iVar64 >> auVar65;
  *(int *)((long)in[0x2d] + 0xc) = iVar24 + iVar64 >> auVar65;
  *(int *)in[0x2e] = (int)lVar56 + iVar64 >> auVar65;
  *(int *)((long)in[0x2e] + 4) = iVar25 + iVar64 >> auVar65;
  *(int *)(in[0x2e] + 1) = (int)lVar57 + iVar64 >> auVar65;
  *(int *)((long)in[0x2e] + 0xc) = iVar26 + iVar64 >> auVar65;
  *(int *)in[0x2f] = (int)lVar58 + iVar64 >> auVar65;
  *(int *)((long)in[0x2f] + 4) = iVar27 + iVar64 >> auVar65;
  *(int *)(in[0x2f] + 1) = (int)lVar59 + iVar64 >> auVar65;
  *(int *)((long)in[0x2f] + 0xc) = iVar28 + iVar64 >> auVar65;
  iVar1 = *(int *)((long)in[0x30] + 4);
  lVar60 = in[0x30][1];
  iVar2 = *(int *)((long)in[0x30] + 0xc);
  lVar61 = in[0x31][0];
  iVar3 = *(int *)((long)in[0x31] + 4);
  lVar62 = in[0x31][1];
  iVar4 = *(int *)((long)in[0x31] + 0xc);
  lVar63 = in[0x32][0];
  iVar5 = *(int *)((long)in[0x32] + 4);
  lVar33 = in[0x32][1];
  iVar6 = *(int *)((long)in[0x32] + 0xc);
  lVar34 = in[0x33][0];
  iVar7 = *(int *)((long)in[0x33] + 4);
  lVar35 = in[0x33][1];
  iVar8 = *(int *)((long)in[0x33] + 0xc);
  lVar36 = in[0x34][0];
  iVar9 = *(int *)((long)in[0x34] + 4);
  lVar37 = in[0x34][1];
  iVar10 = *(int *)((long)in[0x34] + 0xc);
  lVar38 = in[0x35][0];
  iVar11 = *(int *)((long)in[0x35] + 4);
  lVar39 = in[0x35][1];
  iVar12 = *(int *)((long)in[0x35] + 0xc);
  lVar40 = in[0x36][0];
  iVar13 = *(int *)((long)in[0x36] + 4);
  lVar41 = in[0x36][1];
  iVar14 = *(int *)((long)in[0x36] + 0xc);
  lVar42 = in[0x37][0];
  iVar15 = *(int *)((long)in[0x37] + 4);
  lVar43 = in[0x37][1];
  iVar16 = *(int *)((long)in[0x37] + 0xc);
  lVar44 = in[0x38][0];
  iVar17 = *(int *)((long)in[0x38] + 4);
  lVar45 = in[0x38][1];
  iVar18 = *(int *)((long)in[0x38] + 0xc);
  lVar46 = in[0x39][0];
  iVar19 = *(int *)((long)in[0x39] + 4);
  lVar47 = in[0x39][1];
  iVar20 = *(int *)((long)in[0x39] + 0xc);
  lVar48 = in[0x3a][0];
  iVar21 = *(int *)((long)in[0x3a] + 4);
  lVar49 = in[0x3a][1];
  iVar22 = *(int *)((long)in[0x3a] + 0xc);
  lVar50 = in[0x3b][0];
  iVar23 = *(int *)((long)in[0x3b] + 4);
  lVar51 = in[0x3b][1];
  iVar24 = *(int *)((long)in[0x3b] + 0xc);
  lVar52 = in[0x3c][0];
  iVar25 = *(int *)((long)in[0x3c] + 4);
  lVar53 = in[0x3c][1];
  iVar26 = *(int *)((long)in[0x3c] + 0xc);
  lVar54 = in[0x3d][0];
  iVar27 = *(int *)((long)in[0x3d] + 4);
  lVar55 = in[0x3d][1];
  iVar28 = *(int *)((long)in[0x3d] + 0xc);
  lVar56 = in[0x3e][0];
  iVar29 = *(int *)((long)in[0x3e] + 4);
  lVar57 = in[0x3e][1];
  iVar30 = *(int *)((long)in[0x3e] + 0xc);
  lVar58 = in[0x3f][0];
  iVar31 = *(int *)((long)in[0x3f] + 4);
  lVar59 = in[0x3f][1];
  iVar32 = *(int *)((long)in[0x3f] + 0xc);
  *(int *)in[0x30] = (int)in[0x30][0] + iVar64 >> auVar65;
  *(int *)((long)in[0x30] + 4) = iVar1 + iVar64 >> auVar65;
  *(int *)(in[0x30] + 1) = (int)lVar60 + iVar64 >> auVar65;
  *(int *)((long)in[0x30] + 0xc) = iVar2 + iVar64 >> auVar65;
  *(int *)in[0x31] = (int)lVar61 + iVar64 >> auVar65;
  *(int *)((long)in[0x31] + 4) = iVar3 + iVar64 >> auVar65;
  *(int *)(in[0x31] + 1) = (int)lVar62 + iVar64 >> auVar65;
  *(int *)((long)in[0x31] + 0xc) = iVar4 + iVar64 >> auVar65;
  *(int *)in[0x32] = (int)lVar63 + iVar64 >> auVar65;
  *(int *)((long)in[0x32] + 4) = iVar5 + iVar64 >> auVar65;
  *(int *)(in[0x32] + 1) = (int)lVar33 + iVar64 >> auVar65;
  *(int *)((long)in[0x32] + 0xc) = iVar6 + iVar64 >> auVar65;
  *(int *)in[0x33] = (int)lVar34 + iVar64 >> auVar65;
  *(int *)((long)in[0x33] + 4) = iVar7 + iVar64 >> auVar65;
  *(int *)(in[0x33] + 1) = (int)lVar35 + iVar64 >> auVar65;
  *(int *)((long)in[0x33] + 0xc) = iVar8 + iVar64 >> auVar65;
  *(int *)in[0x34] = (int)lVar36 + iVar64 >> auVar65;
  *(int *)((long)in[0x34] + 4) = iVar9 + iVar64 >> auVar65;
  *(int *)(in[0x34] + 1) = (int)lVar37 + iVar64 >> auVar65;
  *(int *)((long)in[0x34] + 0xc) = iVar10 + iVar64 >> auVar65;
  *(int *)in[0x35] = (int)lVar38 + iVar64 >> auVar65;
  *(int *)((long)in[0x35] + 4) = iVar11 + iVar64 >> auVar65;
  *(int *)(in[0x35] + 1) = (int)lVar39 + iVar64 >> auVar65;
  *(int *)((long)in[0x35] + 0xc) = iVar12 + iVar64 >> auVar65;
  *(int *)in[0x36] = (int)lVar40 + iVar64 >> auVar65;
  *(int *)((long)in[0x36] + 4) = iVar13 + iVar64 >> auVar65;
  *(int *)(in[0x36] + 1) = (int)lVar41 + iVar64 >> auVar65;
  *(int *)((long)in[0x36] + 0xc) = iVar14 + iVar64 >> auVar65;
  *(int *)in[0x37] = (int)lVar42 + iVar64 >> auVar65;
  *(int *)((long)in[0x37] + 4) = iVar15 + iVar64 >> auVar65;
  *(int *)(in[0x37] + 1) = (int)lVar43 + iVar64 >> auVar65;
  *(int *)((long)in[0x37] + 0xc) = iVar16 + iVar64 >> auVar65;
  *(int *)in[0x38] = (int)lVar44 + iVar64 >> auVar65;
  *(int *)((long)in[0x38] + 4) = iVar17 + iVar64 >> auVar65;
  *(int *)(in[0x38] + 1) = (int)lVar45 + iVar64 >> auVar65;
  *(int *)((long)in[0x38] + 0xc) = iVar18 + iVar64 >> auVar65;
  *(int *)in[0x39] = (int)lVar46 + iVar64 >> auVar65;
  *(int *)((long)in[0x39] + 4) = iVar19 + iVar64 >> auVar65;
  *(int *)(in[0x39] + 1) = (int)lVar47 + iVar64 >> auVar65;
  *(int *)((long)in[0x39] + 0xc) = iVar20 + iVar64 >> auVar65;
  *(int *)in[0x3a] = (int)lVar48 + iVar64 >> auVar65;
  *(int *)((long)in[0x3a] + 4) = iVar21 + iVar64 >> auVar65;
  *(int *)(in[0x3a] + 1) = (int)lVar49 + iVar64 >> auVar65;
  *(int *)((long)in[0x3a] + 0xc) = iVar22 + iVar64 >> auVar65;
  *(int *)in[0x3b] = (int)lVar50 + iVar64 >> auVar65;
  *(int *)((long)in[0x3b] + 4) = iVar23 + iVar64 >> auVar65;
  *(int *)(in[0x3b] + 1) = (int)lVar51 + iVar64 >> auVar65;
  *(int *)((long)in[0x3b] + 0xc) = iVar24 + iVar64 >> auVar65;
  *(int *)in[0x3c] = (int)lVar52 + iVar64 >> auVar65;
  *(int *)((long)in[0x3c] + 4) = iVar25 + iVar64 >> auVar65;
  *(int *)(in[0x3c] + 1) = (int)lVar53 + iVar64 >> auVar65;
  *(int *)((long)in[0x3c] + 0xc) = iVar26 + iVar64 >> auVar65;
  *(int *)in[0x3d] = (int)lVar54 + iVar64 >> auVar65;
  *(int *)((long)in[0x3d] + 4) = iVar27 + iVar64 >> auVar65;
  *(int *)(in[0x3d] + 1) = (int)lVar55 + iVar64 >> auVar65;
  *(int *)((long)in[0x3d] + 0xc) = iVar28 + iVar64 >> auVar65;
  *(int *)in[0x3e] = (int)lVar56 + iVar64 >> auVar65;
  *(int *)((long)in[0x3e] + 4) = iVar29 + iVar64 >> auVar65;
  *(int *)(in[0x3e] + 1) = (int)lVar57 + iVar64 >> auVar65;
  *(int *)((long)in[0x3e] + 0xc) = iVar30 + iVar64 >> auVar65;
  *(int *)in[0x3f] = iVar64 + (int)lVar58 >> auVar65;
  *(int *)((long)in[0x3f] + 4) = iVar64 + iVar31 >> auVar65;
  *(int *)(in[0x3f] + 1) = iVar64 + (int)lVar59 >> auVar65;
  *(int *)((long)in[0x3f] + 0xc) = iVar64 + iVar32 >> auVar65;
  return;
}

Assistant:

static inline void col_txfm_8x8_rounding(__m128i *in, int shift) {
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));

  in[0] = _mm_add_epi32(in[0], rounding);
  in[1] = _mm_add_epi32(in[1], rounding);
  in[2] = _mm_add_epi32(in[2], rounding);
  in[3] = _mm_add_epi32(in[3], rounding);
  in[4] = _mm_add_epi32(in[4], rounding);
  in[5] = _mm_add_epi32(in[5], rounding);
  in[6] = _mm_add_epi32(in[6], rounding);
  in[7] = _mm_add_epi32(in[7], rounding);
  in[8] = _mm_add_epi32(in[8], rounding);
  in[9] = _mm_add_epi32(in[9], rounding);
  in[10] = _mm_add_epi32(in[10], rounding);
  in[11] = _mm_add_epi32(in[11], rounding);
  in[12] = _mm_add_epi32(in[12], rounding);
  in[13] = _mm_add_epi32(in[13], rounding);
  in[14] = _mm_add_epi32(in[14], rounding);
  in[15] = _mm_add_epi32(in[15], rounding);

  in[0] = _mm_srai_epi32(in[0], shift);
  in[1] = _mm_srai_epi32(in[1], shift);
  in[2] = _mm_srai_epi32(in[2], shift);
  in[3] = _mm_srai_epi32(in[3], shift);
  in[4] = _mm_srai_epi32(in[4], shift);
  in[5] = _mm_srai_epi32(in[5], shift);
  in[6] = _mm_srai_epi32(in[6], shift);
  in[7] = _mm_srai_epi32(in[7], shift);
  in[8] = _mm_srai_epi32(in[8], shift);
  in[9] = _mm_srai_epi32(in[9], shift);
  in[10] = _mm_srai_epi32(in[10], shift);
  in[11] = _mm_srai_epi32(in[11], shift);
  in[12] = _mm_srai_epi32(in[12], shift);
  in[13] = _mm_srai_epi32(in[13], shift);
  in[14] = _mm_srai_epi32(in[14], shift);
  in[15] = _mm_srai_epi32(in[15], shift);
}